

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O0

int anon_unknown.dwarf_1c2d7::RtMidiError_ctor(lua_State *L)

{
  lua_Integer __s;
  RtMidiError *this;
  allocator<char> local_51;
  string local_50;
  RtMidiError *local_30;
  RtMidiError *midierror;
  lua_Integer typ;
  char *message;
  size_t sz;
  lua_State *L_local;
  
  sz = (size_t)L;
  typ = luaL_checklstring(L,2,&message);
  midierror = (RtMidiError *)luaL_optinteger(sz,3,2);
  this = (RtMidiError *)lua_newuserdata(sz,0x30);
  __s = typ;
  local_30 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_51);
  RtMidiError::RtMidiError(this,&local_50,(Type)midierror);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  lua_getfield(sz,0xfff0b9d8,"luartmidi.rtmidierror");
  lua_setmetatable(sz,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiError_ctor(lua_State *L) {
	std::size_t sz;
	const char *message = luaL_checklstring(L, 2, &sz);
	lua_Integer typ = luaL_optinteger(L, 3, RtMidiError::Type::UNSPECIFIED);

	auto midierror = reinterpret_cast<RtMidiError *>(
	 lua_newuserdata(L, sizeof(RtMidiError)));
	new (midierror) RtMidiError {message, static_cast<RtMidiError::Type>(typ)};
	luaL_getmetatable(L, MT_RTMIDIERROR);
	lua_setmetatable(L, -2);
	return 1;
}